

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

UBool __thiscall icu_63::MessagePattern::isOrdinal(MessagePattern *this,int32_t index)

{
  char16_t cVar1;
  UnicodeString *this_00;
  
  this_00 = &this->msg;
  cVar1 = UnicodeString::doCharAt(this_00,index);
  if (((((cVar1 & 0xffdfU) == 0x4f) &&
       (cVar1 = UnicodeString::doCharAt(this_00,index + 1), (cVar1 & 0xffdfU) == 0x52)) &&
      (cVar1 = UnicodeString::doCharAt(this_00,index + 2), (cVar1 & 0xffdfU) == 0x44)) &&
     (((cVar1 = UnicodeString::doCharAt(this_00,index + 3), (cVar1 & 0xffdfU) == 0x49 &&
       (cVar1 = UnicodeString::doCharAt(this_00,index + 4), (cVar1 & 0xffdfU) == 0x4e)) &&
      (cVar1 = UnicodeString::doCharAt(this_00,index + 5), (cVar1 & 0xffdfU) == 0x41)))) {
    cVar1 = UnicodeString::doCharAt(this_00,index + 6);
    return (cVar1 & 0xffdfU) == 0x4c;
  }
  return '\0';
}

Assistant:

UBool
MessagePattern::isOrdinal(int32_t index) {
    UChar c;
    return
        ((c=msg.charAt(index++))==u_o || c==u_O) &&
        ((c=msg.charAt(index++))==u_r || c==u_R) &&
        ((c=msg.charAt(index++))==u_d || c==u_D) &&
        ((c=msg.charAt(index++))==u_i || c==u_I) &&
        ((c=msg.charAt(index++))==u_n || c==u_N) &&
        ((c=msg.charAt(index++))==u_a || c==u_A) &&
        ((c=msg.charAt(index))==u_l || c==u_L);
}